

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void d68000_bra_16(m68k_info *info)

{
  uint uVar1;
  
  uVar1 = read_imm_16(info);
  build_relative_branch(info,0x1b,2,(uint)(uVar1 < 0x8000) * 0x10000 + uVar1 + -0x10000);
  return;
}

Assistant:

static void d68000_bra_16(m68k_info *info)
{
	build_relative_branch(info, M68K_INS_BRA, 2, make_int_16(read_imm_16(info)));
}